

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

uint32_t immutable::rrb_details::size_sub_trie<int,false,6>
                   (ref<immutable::rrb_details::tree_node<int,_false>_> *node,uint32_t shift)

{
  internal_node<int,_false> *p_node;
  rrb_size_table<false> *prVar1;
  uint32_t uVar2;
  internal_node<int,_false> *in_RAX;
  leaf_node<int,_false> *leaf;
  uint uVar3;
  ref<immutable::rrb_details::tree_node<int,_false>_> child;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_28;
  
  p_node = (internal_node<int,_false> *)node->ptr;
  if (shift == 0) {
    uVar2 = p_node->len;
  }
  else {
    if (p_node == (internal_node<int,_false> *)0x0) {
      __assert_fail("ptr != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                    ,0x71a,
                    "T *immutable::ref<immutable::rrb_details::internal_node<int, false>>::operator->() const [T = immutable::rrb_details::internal_node<int, false>]"
                   );
    }
    p_node->_ref_count = p_node->_ref_count + 1;
    prVar1 = (p_node->size_table).ptr;
    if (prVar1 == (rrb_size_table<false> *)0x0) {
      uVar3 = p_node->len - 1;
      local_28.ptr = (tree_node<int,_false> *)p_node->child[uVar3].ptr;
      if ((internal_node<int,_false> *)local_28.ptr != (internal_node<int,_false> *)0x0) {
        ((internal_node<int,_false> *)local_28.ptr)->_ref_count =
             ((internal_node<int,_false> *)local_28.ptr)->_ref_count + 1;
      }
      uVar2 = size_sub_trie<int,false,6>(&local_28,shift - 6);
      uVar2 = uVar2 + (uVar3 << ((byte)shift & 0x1f));
      ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_28);
    }
    else {
      uVar2 = prVar1->size[p_node->len - 1];
      local_28.ptr = (tree_node<int,_false> *)in_RAX;
    }
    release<int>(p_node);
  }
  return uVar2;
}

Assistant:

inline uint32_t size_sub_trie(const ref<tree_node<T, atomic_ref_counting>>& node, uint32_t shift)
      {
      if (shift > 0)
        {
        ref<internal_node<T, atomic_ref_counting>> intern = node;
        if (intern->size_table.ptr == nullptr)
          {
          uint32_t len = intern->len;
          uint32_t child_shift = shift - bits<N>::rrb_bits;
          // TODO: for loopify recursive calls
          /* We're not sure how many are in the last child, so look it up */
          ref<tree_node<T, atomic_ref_counting>> child = intern->child[len - 1];
          uint32_t last_size = size_sub_trie<T, atomic_ref_counting, N>(child, child_shift);
          /* We know all but the last ones are filled, and they have child_shift
             elements in them. */
          return ((len - 1) << shift) + last_size;
          }
        else
          {
          return intern->size_table->size[intern->len - 1];
          }
        }
      else
        {
        leaf_node<T, atomic_ref_counting>* leaf = (leaf_node<T, atomic_ref_counting>*)node.ptr;
        return leaf->len;
        }
      }